

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void selectAddSubqueryTypeInfo(Walker *pWalker,Select *p)

{
  Parse *pParse_00;
  SrcList *pSVar1;
  Select *pSel;
  Table *pTab;
  SrcItem *pFrom;
  SrcList *pTabList;
  int i;
  Parse *pParse;
  Select *p_local;
  Walker *pWalker_local;
  
  if ((p->selFlags & 0x80) == 0) {
    p->selFlags = p->selFlags | 0x80;
    pParse_00 = pWalker->pParse;
    pSVar1 = p->pSrc;
    pTab = (Table *)pSVar1->a;
    for (pTabList._4_4_ = 0; pTabList._4_4_ < pSVar1->nSrc; pTabList._4_4_ = pTabList._4_4_ + 1) {
      if (((((Table *)pTab->pCheck)->tabFlags & 0x4000) != 0) &&
         (*(Select **)&pTab->tnum != (Select *)0x0)) {
        sqlite3SubqueryColumnTypes(pParse_00,(Table *)pTab->pCheck,*(Select **)&pTab->tnum,'@');
      }
      pTab = pTab + 1;
    }
  }
  return;
}

Assistant:

static void selectAddSubqueryTypeInfo(Walker *pWalker, Select *p){
  Parse *pParse;
  int i;
  SrcList *pTabList;
  SrcItem *pFrom;

  if( p->selFlags & SF_HasTypeInfo ) return;
  p->selFlags |= SF_HasTypeInfo;
  pParse = pWalker->pParse;
  assert( (p->selFlags & SF_Resolved) );
  pTabList = p->pSrc;
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab = pFrom->pTab;
    assert( pTab!=0 );
    if( (pTab->tabFlags & TF_Ephemeral)!=0 ){
      /* A sub-query in the FROM clause of a SELECT */
      Select *pSel = pFrom->pSelect;
      if( pSel ){
        sqlite3SubqueryColumnTypes(pParse, pTab, pSel, SQLITE_AFF_NONE);
      }
    }
  }
}